

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void srecmult(double *A,double *B,double *C,int m,int n,int p,int sA,int sB,int sC)

{
  int i_4;
  long lVar1;
  long lVar2;
  long lVar3;
  double *C_00;
  double *C_01;
  double *C_02;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  void *pvVar9;
  ulong uVar10;
  double *pdVar11;
  uint m_00;
  ulong uVar12;
  long lVar13;
  uint p_00;
  long lVar14;
  double *pdVar15;
  double *pdVar16;
  double *pdVar17;
  double *pdVar18;
  uint n_00;
  ulong uVar19;
  void *pvVar20;
  ulong uVar21;
  size_t __size;
  size_t __size_00;
  size_t __size_01;
  double dVar22;
  double *local_90;
  
  if (0xc0 < n + m + p) {
    m_00 = m / 2;
    n_00 = n / 2;
    uVar21 = (ulong)n_00;
    p_00 = p / 2;
    uVar12 = (ulong)p_00;
    lVar1 = (long)(int)n_00;
    pdVar8 = A + lVar1;
    lVar2 = (long)(int)(m_00 * sA);
    local_90 = pdVar8 + lVar2;
    lVar14 = (long)(int)p_00;
    pdVar7 = B + lVar14;
    lVar3 = (long)(int)(n_00 * sB);
    __size = (long)(int)m_00 * 8 * lVar14;
    C_00 = (double *)malloc(__size);
    C_01 = (double *)malloc(__size);
    C_02 = (double *)malloc(__size);
    __size_01 = (long)(int)m_00 * 8 * lVar1;
    pdVar4 = (double *)malloc(__size_01);
    __size_00 = lVar1 * lVar14 * 8;
    pdVar5 = (double *)malloc(__size_00);
    if (1 < m) {
      uVar10 = 0;
      pdVar17 = A;
      pdVar15 = local_90;
      pdVar6 = pdVar4;
      do {
        if (1 < n) {
          uVar19 = 0;
          do {
            pdVar6[uVar19] = pdVar17[uVar19] + pdVar15[uVar19];
            uVar19 = uVar19 + 1;
          } while (uVar21 != uVar19);
        }
        uVar10 = uVar10 + 1;
        pdVar6 = pdVar6 + lVar1;
        pdVar15 = pdVar15 + sA;
        pdVar17 = pdVar17 + sA;
      } while (uVar10 != m_00);
    }
    pdVar17 = pdVar7 + lVar3;
    if (1 < n) {
      lVar13 = 0;
      pdVar15 = B;
      pdVar6 = pdVar17;
      pdVar11 = pdVar5;
      do {
        if (1 < p) {
          uVar10 = 0;
          do {
            pdVar11[uVar10] = pdVar15[uVar10] + pdVar6[uVar10];
            uVar10 = uVar10 + 1;
          } while (uVar12 != uVar10);
        }
        lVar13 = lVar13 + 1;
        pdVar11 = pdVar11 + lVar14;
        pdVar6 = pdVar6 + sB;
        pdVar15 = pdVar15 + sB;
      } while (lVar13 != lVar1);
    }
    pdVar15 = C + (int)(m_00 * sC);
    srecmult(pdVar4,pdVar5,C_00,m_00,n_00,p_00,n_00,p_00,p_00);
    free(pdVar4);
    free(pdVar5);
    pdVar4 = (double *)malloc(__size_01);
    if (1 < m) {
      pdVar5 = A + lVar2;
      uVar10 = 0;
      pdVar6 = local_90;
      pdVar11 = pdVar4;
      do {
        if (1 < n) {
          uVar19 = 0;
          do {
            pdVar11[uVar19] = pdVar5[uVar19] + pdVar6[uVar19];
            uVar19 = uVar19 + 1;
          } while (uVar21 != uVar19);
        }
        uVar10 = uVar10 + 1;
        pdVar11 = pdVar11 + lVar1;
        pdVar6 = pdVar6 + sA;
        pdVar5 = pdVar5 + sA;
      } while (uVar10 != m_00);
    }
    srecmult(pdVar4,B,pdVar15,m_00,n_00,p_00,n_00,sB,sC);
    free(pdVar4);
    pdVar4 = (double *)malloc(__size_00);
    if (1 < n) {
      lVar13 = 0;
      pdVar5 = pdVar7;
      pdVar6 = pdVar17;
      pdVar11 = pdVar4;
      do {
        if (1 < p) {
          uVar10 = 0;
          do {
            pdVar11[uVar10] = pdVar5[uVar10] - pdVar6[uVar10];
            uVar10 = uVar10 + 1;
          } while (uVar12 != uVar10);
        }
        lVar13 = lVar13 + 1;
        pdVar11 = pdVar11 + lVar14;
        pdVar6 = pdVar6 + sB;
        pdVar5 = pdVar5 + sB;
      } while (lVar13 != lVar1);
    }
    srecmult(A,pdVar4,C_01,m_00,n_00,p_00,sA,p_00,p_00);
    free(pdVar4);
    pdVar4 = (double *)malloc(__size_00);
    if (1 < n) {
      lVar13 = 0;
      pdVar5 = B;
      pdVar6 = pdVar4;
      do {
        if (1 < p) {
          uVar10 = 0;
          do {
            pdVar6[uVar10] = pdVar5[lVar3 + uVar10] - pdVar5[uVar10];
            uVar10 = uVar10 + 1;
          } while (uVar12 != uVar10);
        }
        lVar13 = lVar13 + 1;
        pdVar6 = pdVar6 + lVar14;
        pdVar5 = pdVar5 + sB;
      } while (lVar13 != lVar1);
    }
    pdVar5 = C + lVar14;
    srecmult(local_90,pdVar4,C_02,m_00,n_00,p_00,sA,p_00,p_00);
    free(pdVar4);
    pdVar4 = (double *)malloc(__size_01);
    if (1 < m) {
      uVar10 = 0;
      pdVar6 = A;
      pdVar11 = pdVar8;
      pdVar16 = pdVar4;
      do {
        if (1 < n) {
          uVar19 = 0;
          do {
            pdVar16[uVar19] = pdVar6[uVar19] + pdVar11[uVar19];
            uVar19 = uVar19 + 1;
          } while (uVar21 != uVar19);
        }
        uVar10 = uVar10 + 1;
        pdVar16 = pdVar16 + lVar1;
        pdVar11 = pdVar11 + sA;
        pdVar6 = pdVar6 + sA;
      } while (uVar10 != m_00);
    }
    srecmult(pdVar4,pdVar17,pdVar5,m_00,n_00,p_00,n_00,sB,sC);
    free(pdVar4);
    pdVar4 = (double *)malloc(__size_01);
    pdVar6 = (double *)malloc(__size_00);
    if (1 < m) {
      uVar10 = 0;
      pdVar11 = pdVar4;
      do {
        if (1 < n) {
          uVar19 = 0;
          do {
            pdVar11[uVar19] = A[lVar2 + uVar19] - A[uVar19];
            uVar19 = uVar19 + 1;
          } while (uVar21 != uVar19);
        }
        uVar10 = uVar10 + 1;
        pdVar11 = pdVar11 + lVar1;
        A = A + sA;
      } while (uVar10 != m_00);
    }
    pdVar11 = pdVar5 + (int)(m_00 * sC);
    if (1 < n) {
      lVar2 = 0;
      pdVar16 = B;
      pdVar18 = pdVar6;
      do {
        if (1 < p) {
          uVar10 = 0;
          do {
            pdVar18[uVar10] = pdVar16[uVar10] + pdVar7[uVar10];
            uVar10 = uVar10 + 1;
          } while (uVar12 != uVar10);
        }
        lVar2 = lVar2 + 1;
        pdVar18 = pdVar18 + lVar14;
        pdVar7 = pdVar7 + sB;
        pdVar16 = pdVar16 + sB;
      } while (lVar2 != lVar1);
    }
    srecmult(pdVar4,pdVar6,pdVar11,m_00,n_00,p_00,n_00,p_00,sC);
    free(pdVar4);
    free(pdVar6);
    pdVar7 = (double *)malloc(__size_01);
    pdVar4 = (double *)malloc(__size_00);
    if (1 < m) {
      uVar10 = 0;
      pdVar6 = pdVar7;
      do {
        if (1 < n) {
          uVar19 = 0;
          do {
            pdVar6[uVar19] = pdVar8[uVar19] - local_90[uVar19];
            uVar19 = uVar19 + 1;
          } while (uVar21 != uVar19);
        }
        uVar10 = uVar10 + 1;
        pdVar6 = pdVar6 + lVar1;
        local_90 = local_90 + sA;
        pdVar8 = pdVar8 + sA;
      } while (uVar10 != m_00);
    }
    if (1 < n) {
      pdVar8 = B + lVar3;
      lVar2 = 0;
      pdVar6 = pdVar4;
      do {
        if (1 < p) {
          uVar21 = 0;
          do {
            pdVar6[uVar21] = pdVar8[uVar21] + pdVar17[uVar21];
            uVar21 = uVar21 + 1;
          } while (uVar12 != uVar21);
        }
        lVar2 = lVar2 + 1;
        pdVar6 = pdVar6 + lVar14;
        pdVar17 = pdVar17 + sB;
        pdVar8 = pdVar8 + sB;
      } while (lVar2 != lVar1);
    }
    srecmult(pdVar7,pdVar4,C,m_00,n_00,p_00,n_00,p_00,sC);
    free(pdVar7);
    free(pdVar4);
    pvVar9 = malloc(__size);
    if (1 < m) {
      lVar1 = (long)sC;
      uVar21 = (ulong)m_00;
      uVar10 = 0;
      pdVar8 = C_00;
      pdVar7 = C;
      do {
        if (1 < p) {
          uVar19 = 0;
          do {
            pdVar7[uVar19] = pdVar8[uVar19] + pdVar7[uVar19];
            uVar19 = uVar19 + 1;
          } while (uVar12 != uVar19);
        }
        uVar10 = uVar10 + 1;
        pdVar7 = pdVar7 + lVar1;
        pdVar8 = pdVar8 + lVar14;
      } while (uVar10 != uVar21);
      uVar10 = 0;
      pdVar8 = C_02;
      pdVar7 = pdVar5;
      pvVar20 = pvVar9;
      do {
        if (1 < p) {
          uVar19 = 0;
          do {
            *(double *)((long)pvVar20 + uVar19 * 8) = pdVar8[uVar19] - pdVar7[uVar19];
            uVar19 = uVar19 + 1;
          } while (uVar12 != uVar19);
        }
        uVar10 = uVar10 + 1;
        pvVar20 = (void *)((long)pvVar20 + lVar14 * 8);
        pdVar7 = pdVar7 + lVar1;
        pdVar8 = pdVar8 + lVar14;
      } while (uVar10 != uVar21);
      uVar10 = 0;
      pvVar20 = pvVar9;
      do {
        if (1 < p) {
          uVar19 = 0;
          do {
            C[uVar19] = C[uVar19] + *(double *)((long)pvVar20 + uVar19 * 8);
            uVar19 = uVar19 + 1;
          } while (uVar12 != uVar19);
        }
        uVar10 = uVar10 + 1;
        pvVar20 = (void *)((long)pvVar20 + lVar14 * 8);
        C = C + lVar1;
      } while (uVar10 != uVar21);
    }
    free(pvVar9);
    pvVar9 = malloc(__size);
    if (m < 2) {
      free(pvVar9);
    }
    else {
      lVar1 = (long)sC;
      uVar10 = (ulong)m_00;
      uVar21 = 0;
      pdVar8 = C_00;
      pdVar7 = pdVar11;
      do {
        if (1 < p) {
          uVar19 = 0;
          do {
            pdVar7[uVar19] = pdVar8[uVar19] + pdVar7[uVar19];
            uVar19 = uVar19 + 1;
          } while (uVar12 != uVar19);
        }
        uVar21 = uVar21 + 1;
        pdVar7 = pdVar7 + lVar1;
        pdVar8 = pdVar8 + lVar14;
      } while (uVar21 != uVar10);
      uVar21 = 0;
      pdVar8 = C_01;
      pdVar7 = pdVar15;
      pvVar20 = pvVar9;
      do {
        if (1 < p) {
          uVar19 = 0;
          do {
            *(double *)((long)pvVar20 + uVar19 * 8) = pdVar8[uVar19] - pdVar7[uVar19];
            uVar19 = uVar19 + 1;
          } while (uVar12 != uVar19);
        }
        uVar21 = uVar21 + 1;
        pvVar20 = (void *)((long)pvVar20 + lVar14 * 8);
        pdVar7 = pdVar7 + lVar1;
        pdVar8 = pdVar8 + lVar14;
      } while (uVar21 != uVar10);
      uVar21 = 0;
      pvVar20 = pvVar9;
      do {
        if (1 < p) {
          uVar19 = 0;
          do {
            pdVar11[uVar19] = pdVar11[uVar19] + *(double *)((long)pvVar20 + uVar19 * 8);
            uVar19 = uVar19 + 1;
          } while (uVar12 != uVar19);
        }
        uVar21 = uVar21 + 1;
        pvVar20 = (void *)((long)pvVar20 + lVar14 * 8);
        pdVar11 = pdVar11 + lVar1;
      } while (uVar21 != uVar10);
      free(pvVar9);
      uVar21 = 0;
      pdVar8 = C_01;
      do {
        if (1 < p) {
          uVar19 = 0;
          do {
            pdVar5[uVar19] = pdVar8[uVar19] + pdVar5[uVar19];
            uVar19 = uVar19 + 1;
          } while (uVar12 != uVar19);
        }
        uVar21 = uVar21 + 1;
        pdVar5 = pdVar5 + lVar1;
        pdVar8 = pdVar8 + lVar14;
      } while (uVar21 != uVar10);
      uVar21 = 0;
      pdVar8 = C_02;
      do {
        if (1 < p) {
          uVar19 = 0;
          do {
            pdVar15[uVar19] = pdVar8[uVar19] + pdVar15[uVar19];
            uVar19 = uVar19 + 1;
          } while (uVar12 != uVar19);
        }
        uVar21 = uVar21 + 1;
        pdVar15 = pdVar15 + lVar1;
        pdVar8 = pdVar8 + lVar14;
      } while (uVar21 != uVar10);
    }
    free(C_00);
    free(C_01);
    free(C_02);
    return;
  }
  if (0 < m) {
    uVar12 = 0;
    do {
      if (0 < p) {
        uVar21 = 0;
        pdVar8 = B;
        do {
          dVar22 = 0.0;
          if (0 < n) {
            uVar10 = 0;
            pdVar7 = pdVar8;
            do {
              dVar22 = dVar22 + A[uVar10] * *pdVar7;
              uVar10 = uVar10 + 1;
              pdVar7 = pdVar7 + sB;
            } while ((uint)n != uVar10);
          }
          C[uVar12 * (long)sC + uVar21] = dVar22;
          uVar21 = uVar21 + 1;
          pdVar8 = pdVar8 + 1;
        } while (uVar21 != (uint)p);
      }
      uVar12 = uVar12 + 1;
      A = A + sA;
    } while (uVar12 != (uint)m);
  }
  return;
}

Assistant:

void srecmult(double* A, double* B, double* C,int m,int n, int p,int sA,int sB, int sC) {
	register int i,j,k;
	int u,v,t;
	double sum;
	double *A1,*B1;
	double *a11,*a12,*a21,*a22;
	double *b11,*b12,*b21,*b22;
	double *c11,*c12,*c21,*c22;
	double *m1,*m2,*m3,*m4,*m5,*m6,*m7;
	int sm1,sm2,sm3,sm4,sm5,sm6,sm7;
	int sA1,sB1;
	if (m + n + p <= CUTOFF) {
		for (i = 0; i < m; ++i) {
			for (j = 0; j < p; ++j) {
				v = i * sA;
				u = i * sC;
				t = j + u;
				sum = 0.;
				for (k = 0; k < n;++k) {
					sum += A[k + v] * B[j + k * sB];
				}
				C[t] = sum;
			}
		}

		
	} else {
		m/=2;n/=2;p/=2;
		// A size mXn, C size mXp
		a11 = A;
		a12 = A + n;
		a21 = A + m * sA;
		a22 = A + n + m * sA;
		
		//B size nXp
		
		b11 = B;
		b12 = B + p;
		b21 = B + n * sB;
		b22 = B + p + n * sB;
		
		//C size mXp
		
		c11 = C;
		c12 = C + p;
		c21 = C + m * sC;
		c22 = C + p + m * sC;
		
		// m matrices have dimension m X p each. See http://en.wikipedia.org/wiki/Strassen_algorithm
		
		m1 = (double*) malloc(sizeof(double) *m * p);
		sm1 = p;
		
		m3 = (double*) malloc(sizeof(double) *m * p);
		sm3 = p;
		
		m4 = (double*) malloc(sizeof(double) *m * p);
		sm4 = p;
		
		m2 = c21;
		sm2 = sC;
		
		m5 = c12;
		sm5 = sC;
		
		m6 = c22;
		sm6 = sC;
		
		
		m7 = c11;
		sm7 = sC;
		
		//m1
		
		sA1 = n;
		sB1 = p;
		
		A1 = (double*) malloc(sizeof(double) * m * n);
		B1 = (double*) malloc(sizeof(double) * n * p);
		
		madd_stride(a11,a22,A1,m,n,sA,sA,sA1);
		
		madd_stride(b11,b22,B1,n,p,sB,sB,sB1);
		
		srecmult(A1,B1,m1,m,n,p,sA1,sB1,sm1);
		
		free(A1);
		free(B1);
		
		
		//m2
		
		A1 = (double*) malloc(sizeof(double) * m * n);
		
		madd_stride(a21,a22,A1,m,n,sA,sA,sA1);
				
		srecmult(A1,b11,m2,m,n,p,sA1,sB,sm2);
		
		free(A1);
		
		
		//m3
		
		B1 = (double*) malloc(sizeof(double) * n * p);
		//rmsub_stride(B + p,B + p + n * sC,B1,n,p,m,sC,sC,sC/2);
		msub_stride(b12,b22,B1,n,p,sB,sB,sB1);
		srecmult(a11,B1,m3,m,n,p,sA,sB1,sm3);
		
		free(B1);
		
		//m4
		
		B1 = (double*) malloc(sizeof(double) * n * p);
		//rmsub_stride(B + p,B + p + n * sC,B1,n,p,m,sC,sC,sC/2);
		msub_stride(b21,b11,B1,n,p,sB,sB,sB1);
		srecmult(a22,B1,m4,m,n,p,sA,sB1,sm4);
		
		free(B1);
		
		//m5
		
		A1 = (double*) malloc(sizeof(double) * m * n);
		
		madd_stride(a11,a12,A1,m,n,sA,sA,sA1);
				
		srecmult(A1,b22,m5,m,n,p,sA1,sB,sm5);
		
		free(A1);
		
		
		//m6
		
		A1 = (double*) malloc(sizeof(double) * m * n);
		B1 = (double*) malloc(sizeof(double) * n * p);
		
		msub_stride(a21,a11,A1,m,n,sA,sA,sA1);
		madd_stride(b11,b12,B1,n,p,sB,sB,sB1);
		srecmult(A1,B1,m6,m,n,p,sA1,sB1,sm6);
	
		free(A1);
		free(B1);
		
		//m7
		
		A1 = (double*) malloc(sizeof(double) * m * n);
		B1 = (double*) malloc(sizeof(double) * n * p);
		
		msub_stride(a12,a22,A1,m,n,sA,sA,sA1);
		madd_stride(b21,b22,B1,n,p,sB,sB,sB1);
		srecmult(A1,B1,m7,m,n,p,sA1,sB1,sm7);
	
		free(A1);
		free(B1);
		
		
		// c11
		
		A1 = (double*) malloc(sizeof(double) * m * p);
		sA1 = p;
		madd_stride(m1,m7,m7,m,p,sm1,sm7,sm7);
		msub_stride(m4,m5,A1,m,p,sm4,sm5,sA1);
		madd_stride(m7,A1,m7,m,p,sm7,sA1,sm7);
		
		free(A1);
		
		
		// c22
		
		A1 = (double*) malloc(sizeof(double) * m * p);
		sA1 = p;
		madd_stride(m1,m6,m6,m,p,sm1,sm6,sm6);
		msub_stride(m3,m2,A1,m,p,sm3,sm2,sA1);
		madd_stride(m6,A1,m6,m,p,sm6,sA1,sm6);
		
		free(A1);
		
		//c12 
		
		madd_stride(m3,m5,m5,m,p,sm3,sm5,sm5);
		
		//c21
		
		madd_stride(m4,m2,m2,m,p,sm4,sm2,sm2);
		
		free(m1);
		free(m3);
		free(m4);
	}
}